

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O1

void __thiscall CommandLineParser::fail(CommandLineParser *this,string *message)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"while parsing option ",&this->m_option);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_88 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(message->_M_dataplus)._M_p);
  local_68 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_68 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  *(undefined ***)this_00 = &PTR__runtime_error_0010ad60;
  __cxa_throw(this_00,&CommandLineParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void 
CommandLineParser::fail( std::string message )
{
  throw CommandLineParserException( "while parsing option " + m_option+
            ",\n" + message );
}